

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int detectsuffix(char *str,char *suffix)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  char *local_20;
  char *suffix_local;
  char *str_local;
  
  local_20 = suffix;
  suffix_local = str;
  while( true ) {
    iVar1 = toupper((int)*suffix_local);
    iVar2 = toupper((int)*local_20);
    if (iVar1 != iVar2) {
      if (*local_20 == '\0') {
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*suffix_local] & 0x2000) != 0) {
          suffix_local = suffix_local + 1;
        }
        str_local._4_4_ = (uint)(*suffix_local == '\0');
      }
      else {
        str_local._4_4_ = 0;
      }
      return str_local._4_4_;
    }
    if (*suffix_local == '\0') break;
    suffix_local = suffix_local + 1;
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

static int detectsuffix(const char * str, const char * suffix) {
	/* scan pairwise through strings until mismatch detected */
	while ( toupper(*str) == toupper(*suffix) ) {
		/* printf("'%c' '%c'\n", *str, *suffix); */

		/* return 1 (success) if match persists until the string terminator */
		if (*str == '\0') {
			return 1;
		}

		/* next chars */
		str++;
		suffix++;
	}

	/* printf("'%c' '%c' mismatch\n", *str, *suffix); */

	/* return 0 (fail) if the matching did not consume the entire suffix */
	if (*suffix != 0) {
		return 0;    /* failed to consume entire suffix */
	}

	/* skip any remaining whitespace in str */
	while (isspace(*str)) {
		str++;
	}

	/* return 1 (success) if we have reached end of str else return 0 (fail) */
	return (*str == '\0') ? 1 : 0;
}